

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void riscv_translate_init_riscv32(uc_struct_conflict12 *uc)

{
  long offset;
  TCGContext_conflict9 *s;
  TCGTemp *pTVar1;
  long lVar2;
  
  s = uc->tcg_ctx;
  s->cpu_gpr[0] = (TCGv_i32)0x0;
  lVar2 = 0;
  do {
    offset = lVar2 + 4;
    pTVar1 = tcg_global_mem_new_internal_riscv32
                       (s,TCG_TYPE_I32,s->cpu_env,offset,
                        *(char **)((long)riscv_int_regnames_riscv32 + lVar2 * 2 + 8));
    *(long *)((long)s->cpu_gpr + lVar2 * 2 + 8) = (long)pTVar1 - (long)s;
    lVar2 = offset;
  } while (offset != 0x7c);
  lVar2 = 0;
  do {
    pTVar1 = tcg_global_mem_new_internal_riscv32
                       (s,TCG_TYPE_I64,s->cpu_env,lVar2 + 0x80,
                        *(char **)((long)riscv_fpr_regnames_riscv32 + lVar2));
    *(long *)((long)s->cpu_fpr + lVar2) = (long)pTVar1 - (long)s;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x100);
  pTVar1 = tcg_global_mem_new_internal_riscv32(s,TCG_TYPE_I32,s->cpu_env,0x180,"pc");
  s->cpu_pc = (TCGv_i32)((long)pTVar1 - (long)s);
  pTVar1 = tcg_global_mem_new_internal_riscv32(s,TCG_TYPE_I32,s->cpu_env,0x184,"load_res");
  s->load_res = (TCGv_i32)((long)pTVar1 - (long)s);
  pTVar1 = tcg_global_mem_new_internal_riscv32(s,TCG_TYPE_I32,s->cpu_env,0x188,"load_val");
  s->load_val = (TCGv_i32)((long)pTVar1 - (long)s);
  return;
}

Assistant:

void riscv_translate_init(struct uc_struct *uc)
{
    int i;
    TCGContext *tcg_ctx = uc->tcg_ctx;

    /* cpu_gpr[0] is a placeholder for the zero register. Do not use it. */
    /* Use the gen_set_gpr and gen_get_gpr helper functions when accessing */
    /* registers, unless you specifically block reads/writes to reg 0 */
    tcg_ctx->cpu_gpr[0] = NULL;

    for (i = 1; i < 32; i++) {
        tcg_ctx->cpu_gpr[i] = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env,
            offsetof(CPURISCVState, gpr[i]), riscv_int_regnames[i]);
    }

    for (i = 0; i < 32; i++) {
        tcg_ctx->cpu_fpr[i] = tcg_global_mem_new_i64(tcg_ctx, tcg_ctx->cpu_env,
            offsetof(CPURISCVState, fpr[i]), riscv_fpr_regnames[i]);
    }

    tcg_ctx->cpu_pc = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPURISCVState, pc), "pc");
    tcg_ctx->load_res = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPURISCVState, load_res),
                             "load_res");
    tcg_ctx->load_val = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPURISCVState, load_val),
                             "load_val");
}